

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

char * ures_toUTF8String(UChar *s16,int32_t length16,char *dest,int32_t *pLength,UBool forceCopy,
                        UErrorCode *status)

{
  char *pcVar1;
  int iVar2;
  int32_t destCapacity;
  int iVar3;
  
  destCapacity = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (pLength != (int32_t *)0x0) {
      destCapacity = *pLength;
    }
    if ((-1 < destCapacity) && (dest != (char *)0x0 || destCapacity == 0)) {
      if (length16 != 0) {
        if (destCapacity < length16) {
          dest = (char *)0x0;
          destCapacity = 0;
        }
        else if (length16 < 0x2aaaaaab && forceCopy == '\0') {
          iVar2 = length16 * 3 + 1;
          iVar3 = destCapacity - iVar2;
          if (iVar3 == 0 || destCapacity < iVar2) {
            iVar3 = 0;
          }
          if (destCapacity < iVar2) {
            iVar2 = destCapacity;
          }
          destCapacity = iVar2;
          dest = dest + iVar3;
        }
        pcVar1 = u_strToUTF8_63(dest,destCapacity,pLength,s16,length16,status);
        return pcVar1;
      }
      if (pLength != (int32_t *)0x0) {
        *pLength = 0;
      }
      if (forceCopy != '\0') {
        u_terminateChars_63(dest,destCapacity,0,status);
        return dest;
      }
      return "";
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

static const char *
ures_toUTF8String(const UChar *s16, int32_t length16,
                  char *dest, int32_t *pLength,
                  UBool forceCopy,
                  UErrorCode *status) {
    int32_t capacity;

    if (U_FAILURE(*status)) {
        return NULL;
    }
    if (pLength != NULL) {
        capacity = *pLength;
    } else {
        capacity = 0;
    }
    if (capacity < 0 || (capacity > 0 && dest == NULL)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if (length16 == 0) {
        /* empty string, return as read-only pointer */
        if (pLength != NULL) {
            *pLength = 0;
        }
        if (forceCopy) {
            u_terminateChars(dest, capacity, 0, status);
            return dest;
        } else {
            return "";
        }
    } else {
        /* We need to transform the string to the destination buffer. */
        if (capacity < length16) {
            /* No chance for the string to fit. Pure preflighting. */
            return u_strToUTF8(NULL, 0, pLength, s16, length16, status);
        }
        if (!forceCopy && (length16 <= 0x2aaaaaaa)) {
            /*
             * We know the string will fit into dest because each UChar turns
             * into at most three UTF-8 bytes. Fill the latter part of dest
             * so that callers do not expect to use dest as a string pointer,
             * hopefully leading to more robust code for when resource bundles
             * may store UTF-8 natively.
             * (In which case dest would not be used at all.)
             *
             * We do not do this if forceCopy=TRUE because then the caller
             * expects the string to start exactly at dest.
             *
             * The test above for <= 0x2aaaaaaa prevents overflows.
             * The +1 is for the NUL terminator.
             */
            int32_t maxLength = 3 * length16 + 1;
            if (capacity > maxLength) {
                dest += capacity - maxLength;
                capacity = maxLength;
            }
        }
        return u_strToUTF8(dest, capacity, pLength, s16, length16, status);
    }
}